

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  cmCTestSubmitHandler *pcVar3;
  bool bVar4;
  ulong uVar5;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  iterator __first;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *range;
  char *value;
  string_view arg;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:113:45)>
  local_350;
  TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:113:45)>
  local_340;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> local_330;
  cmCTestSubmitCommand *local_300;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2f8;
  undefined1 local_2e8 [8];
  cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:113:45)>_>
  parts;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> local_288;
  cmCTestSubmitHandler *local_250;
  cmCTestSubmitHandler *handler;
  string local_240;
  string_view local_220;
  undefined1 local_210 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraFiles;
  string local_1f0;
  cmValue local_1d0;
  cmValue extraFilesVariable;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  notesFiles;
  string local_198;
  cmValue local_178;
  cmValue notesFilesVariable;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue submitURL;
  cmCTestSubmitCommand *this_local;
  
  submitURL.Value = (string *)this;
  uVar5 = std::__cxx11::string::empty();
  local_42 = 0;
  local_55 = 0;
  if ((uVar5 & 1) == 0) {
    cmValue::cmValue(&local_20,&this->SubmitURL);
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CTEST_SUBMIT_URL",&local_41);
    local_55 = 1;
    local_20 = cmMakefile::GetDefinition(pcVar1,&local_40);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  bVar4 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar4) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar6 = cmValue::operator*[abi_cxx11_(&local_20);
    cmCTest::SetCTestConfiguration
              (pcVar2,"SubmitURL",psVar6,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CTEST_DROP_METHOD",&local_79);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropMethod",&local_78,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CTEST_DROP_SITE_USER",&local_a1);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSiteUser",&local_a0,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CTEST_DROP_SITE_PASSWORD",&local_c9);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSitePassword",&local_c8,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CTEST_DROP_SITE",&local_f1);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropSite",&local_f0,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CTEST_DROP_LOCATION",&local_119);
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar2,pcVar1,"DropLocation",&local_118,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CTEST_CURL_OPTIONS",&local_141);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CurlOptions",&local_140,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"CTEST_SUBMIT_INACTIVITY_TIMEOUT",
             (allocator<char> *)((long)&notesFilesVariable.Value + 7));
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"SubmitInactivityTimeout",&local_168,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&notesFilesVariable.Value + 7));
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CTEST_NOTES_FILES",
             (allocator<char> *)
             ((long)&notesFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_178 = cmMakefile::GetDefinition(pcVar1,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&notesFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_178);
  if (bVar4) {
    psVar6 = cmValue::operator*[abi_cxx11_(&local_178);
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    extraFilesVariable.Value = (string *)arg._M_len;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8,arg,false);
    cmCTest::GenerateNotesFile
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"CTEST_EXTRA_SUBMIT_FILES",
             (allocator<char> *)
             ((long)&extraFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1d0 = cmMakefile::GetDefinition(pcVar1,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&extraFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_1d0);
  if (bVar4) {
    psVar6 = cmValue::operator*[abi_cxx11_(&local_1d0);
    local_220 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_210,local_220,false);
    bVar4 = cmCTest::SubmitExtraFiles
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_210);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"problem submitting extra files.",
                 (allocator<char> *)((long)&handler + 7));
      cmCommand::SetError((cmCommand *)this,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
      this_local = (cmCTestSubmitCommand *)0x0;
    }
    handler._0_4_ = (uint)!bVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_210);
    if ((uint)handler != 0) {
      return (cmCTestGenericHandler *)this_local;
    }
  }
  local_250 = cmCTest::GetSubmitHandler
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(local_250->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])();
  bVar4 = std::optional::operator_cast_to_bool((optional *)&this->Files);
  pcVar3 = local_250;
  if (bVar4) {
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_288._M_t._M_impl._0_8_ = 0;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_288._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::set
              (&local_288);
    cmCTestSubmitHandler::SelectParts(pcVar3,&local_288);
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::~set
              (&local_288);
    pcVar3 = local_250;
    pvVar7 = &std::
              optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator->(&this->Files)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(pvVar7);
    pvVar7 = &std::
              optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator->(&this->Files)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    parts.End.Func.this =
         (cmCTestSubmitCommand *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar7);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_2b8,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )parts.End.Func.this);
    cmCTestSubmitHandler::SelectFiles(pcVar3,&local_2b8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_2b8);
  }
  bVar4 = std::optional::operator_cast_to_bool((optional *)&this->Parts);
  if (bVar4) {
    range = std::
            optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&this->Parts);
    local_2f8 = cmMakeRange<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          (range);
    local_300 = this;
    cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
    ::transform<cmCTestSubmitCommand::InitializeHandler()::__0>
              ((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:113:45)>_>
                *)local_2e8,&local_2f8,(anon_class_8_1_8991fb9c_for_Func)this);
    pcVar3 = local_250;
    local_340 = cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx:113:45)>_>
                ::begin((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:113:45)>_>
                         *)local_2e8);
    local_350 = cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx:113:45)>_>
                ::end((cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestSubmitCommand_cxx:113:45)>_>
                       *)local_2e8);
    std::set<cmCTest::Part,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>::
    set<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmCTestSubmitCommand::InitializeHandler()::__0>>
              ((set<cmCTest::Part,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>> *)
               &local_330,local_340,local_350);
    cmCTestSubmitHandler::SelectParts(pcVar3,&local_330);
    std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::~set
              (&local_330);
  }
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->HttpHeaders).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if (!bVar4) {
    cmCTestSubmitHandler::SetHttpHeaders
              (local_250,
               &(this->HttpHeaders).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  }
  pcVar3 = local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"RetryDelay",&local_371);
  cmCTestGenericHandler::SetOption
            (&pcVar3->super_cmCTestGenericHandler,&local_370,&this->RetryDelay);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  pcVar3 = local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"RetryCount",&local_399);
  cmCTestGenericHandler::SetOption
            (&pcVar3->super_cmCTestGenericHandler,&local_398,&this->RetryCount);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  pcVar3 = local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"InternalTest",&local_3c1)
  ;
  value = "OFF";
  if ((this->InternalTest & 1U) != 0) {
    value = "ON";
  }
  cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_3c0,value);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  cmCTestGenericHandler::SetQuiet
            (&local_250->super_cmCTestGenericHandler,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  pcVar3 = local_250;
  if ((this->CDashUpload & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"CDashUploadFile",&local_3e9);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_3e8,&this->CDashUploadFile);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    pcVar3 = local_250;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"CDashUploadType",&local_411);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_410,&this->CDashUploadType);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
  }
  return &local_250->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  cmValue submitURL = !this->SubmitURL.empty()
    ? cmValue(this->SubmitURL)
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", *submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SubmitInactivityTimeout",
    "CTEST_SUBMIT_INACTIVITY_TIMEOUT", this->Quiet);

  cmValue notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    std::vector<std::string> notesFiles = cmExpandedList(*notesFilesVariable);
    this->CTest->GenerateNotesFile(notesFiles);
  }

  cmValue extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    std::vector<std::string> extraFiles = cmExpandedList(*extraFilesVariable);
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   if(this->Files) block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->Files) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(
      std::set<std::string>(this->Files->begin(), this->Files->end()));
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->Parts) {
    auto parts =
      cmMakeRange(*(this->Parts)).transform([this](std::string const& arg) {
        return this->CTest->GetPartFromName(arg);
      });
    handler->SelectParts(std::set<cmCTest::Part>(parts.begin(), parts.end()));
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay);
  handler->SetOption("RetryCount", this->RetryCount);
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile);
    handler->SetOption("CDashUploadType", this->CDashUploadType);
  }
  return handler;
}